

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,string *bech32_hrp)

{
  ulong uVar1;
  NetType_conflict local_84;
  CfdSourceLocation local_78;
  SchnorrPubkey local_60;
  allocator local_31;
  string *local_30;
  string *bech32_hrp_local;
  SchnorrPubkey *internal_pubkey_local;
  TaprootScriptTree *tree_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_30 = bech32_hrp;
  bech32_hrp_local = (string *)internal_pubkey;
  internal_pubkey_local = (SchnorrPubkey *)tree;
  tree_local._0_4_ = witness_ver;
  tree_local._4_4_ = type;
  _witness_ver_local = this;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_84 = kCfdConnectionError;
  }
  else {
    local_84 = tree_local._4_4_;
  }
  this->type_ = local_84;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = (WitnessVersion)tree_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_31);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree
            (&this->script_tree_,(TaprootScriptTree *)internal_pubkey_local);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  TapBranch::GetTweakedPubkey
            (&local_60,(TapBranch *)internal_pubkey_local,(SchnorrPubkey *)bech32_hrp_local,
             (bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_60);
  SchnorrPubkey::~SchnorrPubkey(&local_60);
  CalculateTaproot(this,local_30);
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x303;
  local_78.funcname = "Address";
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_78,"call Address({},{},{})",&this->type_,&this->addr_type_,local_30);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey, const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}